

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

ON_BezierCurve * __thiscall ON_BezierCurve::operator=(ON_BezierCurve *this,ON_3dPointArray *cv)

{
  bool bVar1;
  int order;
  ON_3dPoint *this_00;
  double *Point;
  int local_1c;
  int i;
  ON_3dPointArray *cv_local;
  ON_BezierCurve *this_local;
  
  order = ON_SimpleArray<ON_3dPoint>::Count(&cv->super_ON_SimpleArray<ON_3dPoint>);
  bVar1 = Create(this,3,false,order);
  if (bVar1) {
    for (local_1c = 0; local_1c < this->m_order; local_1c = local_1c + 1) {
      this_00 = ON_SimpleArray<ON_3dPoint>::operator[]
                          (&cv->super_ON_SimpleArray<ON_3dPoint>,local_1c);
      Point = ON_3dPoint::operator_cast_to_double_(this_00);
      SetCV(this,local_1c,intrinsic_point_style,Point);
    }
  }
  return this;
}

Assistant:

ON_BezierCurve& ON_BezierCurve::operator=(const ON_3dPointArray& cv)
{
  if ( Create( 3, false, cv.Count() ) )
  {
    int i;
    for ( i = 0; i < m_order; i++ )
      SetCV( i, ON::intrinsic_point_style, cv[i] );
  }
  return *this;
}